

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void mempool_align(void)

{
  void *pvVar1;
  int local_12c;
  int i_1;
  uintptr_t addr;
  int i;
  void *ptr [32];
  uint local_c;
  uint32_t size;
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","mempool_align");
  local_c = 8;
  do {
    if (0xfff < local_c) {
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/mempool.c",0x76,
          "line %d");
      _space(_stdout);
      printf("# *** %s: done ***\n","mempool_align");
      check_plan();
      return;
    }
    mempool_create(&pool,&cache,local_c);
    for (addr._4_4_ = 0; addr._4_4_ < 0x20; addr._4_4_ = addr._4_4_ + 1) {
      pvVar1 = mempool_alloc(&pool);
      *(void **)(&stack0xfffffffffffffee8 + (long)addr._4_4_ * 8) = pvVar1;
      if (*(ulong *)(&stack0xfffffffffffffee8 + (long)addr._4_4_ * 8) % (ulong)local_c != 0) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","aligment","wrong",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/mempool.c"
                ,0x70,"mempool_align");
        exit(-1);
      }
    }
    for (local_12c = 0; local_12c < 0x20; local_12c = local_12c + 1) {
      mempool_free(&pool,*(void **)(&stack0xfffffffffffffee8 + (long)local_12c * 8));
    }
    mempool_destroy(&pool);
    local_c = local_c << 1;
  } while( true );
}

Assistant:

void
mempool_align()
{
	plan(1);
	header();

	for (uint32_t size = OBJSIZE_MIN; size < OBJSIZE_MAX; size <<= 1) {
		mempool_create(&pool, &cache, size);
		void *ptr[32];
		for (int i = 0; i < (int)lengthof(ptr); i++) {
			ptr[i] = mempool_alloc(&pool);
			uintptr_t addr = (uintptr_t)ptr[i];
			if (addr % size)
				fail("aligment", "wrong");
		}
		for (int i = 0; i < (int)lengthof(ptr); i++)
			mempool_free(&pool, ptr[i]);
		mempool_destroy(&pool);
	}
	ok(true);

	footer();
	check_plan();
}